

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

void __thiscall
spdlog::logger::log_<char*&,char*&,char*&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,char **args,char **args_1,
          char **args_2)

{
  __int_type_conflict _Var1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  memory_buf_t buf;
  undefined1 local_1c8 [24];
  time_point local_1b0;
  char *local_1a8;
  size_t local_1a0;
  size_t sStack_198;
  undefined4 local_190;
  undefined4 uStack_18c;
  int iStack_188;
  undefined4 uStack_184;
  char *local_180;
  char *local_178;
  size_t local_170;
  pointer local_168;
  undefined8 uStack_160;
  buffer<char> local_158;
  char local_138 [264];
  
  iVar2 = (this->level_).super___atomic_base<int>._M_i;
  _Var1 = (this->tracer_).enabled_._M_base._M_i;
  if (((int)lvl < iVar2 & (_Var1 ^ 1U)) == 0) {
    local_158.ptr_ = local_138;
    local_158.size_ = 0;
    local_158._vptr_buffer = (_func_int **)&PTR_grow_0030b930;
    local_158.capacity_ = 0xfa;
    local_1c8._0_8_ = *args;
    local_1c8._16_8_ = *args_1;
    local_1a8 = *args_2;
    args_00.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_1c8;
    args_00.desc_ = 0xccc;
    ::fmt::v8::detail::vformat_to<char>(&local_158,fmt,args_00,(locale_ref)0x0);
    sVar4 = local_158.size_;
    pcVar3 = local_158.ptr_;
    local_168 = (this->name_)._M_dataplus._M_p;
    uStack_160 = (this->name_)._M_string_length;
    local_1b0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_1c8._0_8_ = local_168;
    local_1c8._8_4_ = (undefined4)uStack_160;
    local_1c8._12_4_ = uStack_160._4_4_;
    local_1c8._16_4_ = lvl;
    if (*(char *)(in_FS_OFFSET + -8) == '\0') {
      local_1a8 = (char *)syscall(0xba);
      *(char **)(in_FS_OFFSET + -0x10) = local_1a8;
      *(undefined1 *)(in_FS_OFFSET + -8) = 1;
    }
    else {
      local_1a8 = *(char **)(in_FS_OFFSET + -0x10);
    }
    local_1a0 = 0;
    sStack_198 = 0;
    local_190 = loc.filename._0_4_;
    uStack_18c = loc.filename._4_4_;
    iStack_188 = loc.line;
    uStack_184 = loc._12_4_;
    local_180 = loc.funcname;
    local_178 = pcVar3;
    local_170 = sVar4;
    if (iVar2 <= (int)lvl) {
      (*this->_vptr_logger[3])(this,local_1c8);
    }
    if ((_Var1 & 1U) != 0) {
      details::backtracer::push_back(&this->tracer_,(log_msg *)local_1c8);
    }
    if (local_158.ptr_ != local_138) {
      operator_delete(local_158.ptr_,local_158.capacity_);
    }
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&... args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
#ifdef SPDLOG_USE_STD_FORMAT
            memory_buf_t buf = std::vformat(fmt, std::make_format_args(std::forward<Args>(args)...));
#else
            memory_buf_t buf;
            fmt::detail::vformat_to(buf, fmt, fmt::make_format_args(std::forward<Args>(args)...));
#endif
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }